

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_service_interface_factory
          (t_cpp_generator *this,t_service *tservice,string *style)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_service *ptVar3;
  t_service *ttype;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  string singleton_factory_name;
  string extends;
  string factory_name;
  string service_if_name;
  string base_if_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  std::operator+(&local_88,&(this->super_t_oop_generator).super_t_generator.service_name_,style);
  std::operator+(&local_c8,&local_88,"If");
  std::__cxx11::string::~string((string *)&local_88);
  ptVar3 = tservice;
  do {
    ttype = ptVar3;
    ptVar3 = ttype->extends_;
  } while (ptVar3 != (t_service *)0x0);
  type_name_abi_cxx11_(&local_108,this,&ttype->super_t_type,false,false);
  std::operator+(&local_e8,&local_108,style);
  std::operator+(&local_88,&local_e8,"If");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::operator+(&local_e8,&local_c8,"Factory");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_168,this,&tservice->extends_->super_t_type,false,false);
    std::operator+(&local_148," : virtual public ",&local_168);
    std::operator+(&bStack_188,&local_148,style);
    std::operator+(&local_128,&bStack_188,"IfFactory");
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&bStack_188);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  poVar1 = &this->f_header_;
  poVar4 = std::operator<<((ostream *)poVar1,"class ");
  poVar4 = std::operator<<(poVar4,(string *)&local_e8);
  poVar4 = std::operator<<(poVar4,(string *)&local_108);
  poVar4 = std::operator<<(poVar4," {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,"typedef ");
  poVar4 = std::operator<<(poVar4,(string *)&local_c8);
  poVar4 = std::operator<<(poVar4," Handler;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&bStack_188,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&bStack_188);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,(string *)&local_e8);
  poVar4 = std::operator<<(poVar4,"() {}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"virtual ");
  poVar4 = std::operator<<(poVar4,(string *)&local_c8);
  poVar4 = std::operator<<(poVar4,"* getHandler(");
  poVar4 = std::operator<<(poVar4,"const ::apache::thrift::TConnectionInfo& connInfo)");
  pcVar6 = " override";
  pcVar5 = " override";
  if (local_108._M_string_length == 0) {
    pcVar5 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," = 0;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_168);
  poVar4 = std::operator<<(poVar4,"virtual void releaseHandler(");
  poVar4 = std::operator<<(poVar4,(string *)&local_88);
  poVar4 = std::operator<<(poVar4,"* /* handler */)");
  if (local_108._M_string_length == 0) {
    pcVar6 = "";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," = 0;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  std::operator<<(poVar4,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&bStack_188);
  std::__cxx11::string::~string((string *)&local_128);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar4 = std::operator<<((ostream *)poVar1,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator+(&local_128,&local_c8,"SingletonFactory");
  poVar4 = std::operator<<((ostream *)poVar1,"class ");
  poVar4 = std::operator<<(poVar4,(string *)&local_128);
  poVar4 = std::operator<<(poVar4," : virtual public ");
  poVar4 = std::operator<<(poVar4,(string *)&local_e8);
  poVar4 = std::operator<<(poVar4," {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," public:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&bStack_188,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&bStack_188);
  poVar4 = std::operator<<(poVar4,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,"(const ::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&local_c8);
  poVar4 = std::operator<<(poVar4,">& iface) : iface_(iface) {}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_148);
  poVar4 = std::operator<<(poVar4,"virtual ~");
  poVar4 = std::operator<<(poVar4,(string *)&local_128);
  poVar4 = std::operator<<(poVar4,"() {}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_168);
  poVar4 = std::operator<<(poVar4,"virtual ");
  poVar4 = std::operator<<(poVar4,(string *)&local_c8);
  poVar4 = std::operator<<(poVar4,"* getHandler(");
  poVar4 = std::operator<<(poVar4,"const ::apache::thrift::TConnectionInfo&) override {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_a8);
  poVar4 = std::operator<<(poVar4,"  return iface_.get();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_48);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_68);
  poVar4 = std::operator<<(poVar4,"virtual void releaseHandler(");
  poVar4 = std::operator<<(poVar4,(string *)&local_88);
  poVar4 = std::operator<<(poVar4,"* /* handler */) override {}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&bStack_188);
  poVar4 = std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," protected:");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&bStack_188,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&bStack_188);
  poVar4 = std::operator<<(poVar4,"::std::shared_ptr<");
  poVar4 = std::operator<<(poVar4,(string *)&local_c8);
  poVar4 = std::operator<<(poVar4,"> iface_;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&bStack_188);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar4 = std::operator<<((ostream *)poVar1,"};");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void t_cpp_generator::generate_service_interface_factory(t_service* tservice, string style) {
  string service_if_name = service_name_ + style + "If";

  // Figure out the name of the upper-most parent class.
  // Getting everything to work out properly with inheritance is annoying.
  // Here's what we're doing for now:
  //
  // - All handlers implement getHandler(), but subclasses use covariant return
  //   types to return their specific service interface class type.  We have to
  //   use raw pointers because of this; shared_ptr<> can't be used for
  //   covariant return types.
  //
  // - Since we're not using shared_ptr<>, we also provide a releaseHandler()
  //   function that must be called to release a pointer to a handler obtained
  //   via getHandler().
  //
  //   releaseHandler() always accepts a pointer to the upper-most parent class
  //   type.  This is necessary since the parent versions of releaseHandler()
  //   may accept any of the parent types, not just the most specific subclass
  //   type.  Implementations can use dynamic_cast to cast the pointer to the
  //   subclass type if desired.
  t_service* base_service = tservice;
  while (base_service->get_extends() != nullptr) {
    base_service = base_service->get_extends();
  }
  string base_if_name = type_name(base_service) + style + "If";

  // Generate the abstract factory class
  string factory_name = service_if_name + "Factory";
  string extends;
  if (tservice->get_extends() != nullptr) {
    extends = " : virtual public " + type_name(tservice->get_extends()) + style + "IfFactory";
  }

  f_header_ << "class " << factory_name << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "typedef " << service_if_name << " Handler;" << endl << endl << indent()
            << "virtual ~" << factory_name << "() {}" << endl << endl << indent() << "virtual "
            << service_if_name << "* getHandler("
            << "const ::apache::thrift::TConnectionInfo& connInfo)"
            << (extends.empty() ? "" : " override") << " = 0;" << endl << indent()
            << "virtual void releaseHandler(" << base_if_name << "* /* handler */)"
            << (extends.empty() ? "" : " override") << " = 0;" << endl << indent();

  indent_down();
  f_header_ << "};" << endl << endl;

  // Generate the singleton factory class
  string singleton_factory_name = service_if_name + "SingletonFactory";
  f_header_ << "class " << singleton_factory_name << " : virtual public " << factory_name << " {"
            << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << singleton_factory_name << "(const ::std::shared_ptr<" << service_if_name
            << ">& iface) : iface_(iface) {}" << endl << indent() << "virtual ~"
            << singleton_factory_name << "() {}" << endl << endl << indent() << "virtual "
            << service_if_name << "* getHandler("
            << "const ::apache::thrift::TConnectionInfo&) override {" << endl << indent()
            << "  return iface_.get();" << endl << indent() << "}" << endl << indent()
            << "virtual void releaseHandler(" << base_if_name << "* /* handler */) override {}" << endl;

  f_header_ << endl << " protected:" << endl << indent() << "::std::shared_ptr<" << service_if_name
            << "> iface_;" << endl;

  indent_down();
  f_header_ << "};" << endl << endl;
}